

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::Texture2DLodControlCase
          (Texture2DLodControlCase *this,Context *context,char *name,char *desc,deUint32 minFilter)

{
  RenderContext *context_00;
  TestContext *this_00;
  TestLog *log;
  deUint32 minFilter_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  Texture2DLodControlCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__Texture2DLodControlCase_01596218;
  this->m_texWidth = 0x40;
  this->m_texHeight = 0x40;
  this->m_minFilter = minFilter;
  this->m_texture = (Texture2D *)0x0;
  context_00 = Context::getRenderContext(context);
  this_00 = Context::getTestContext(context);
  log = tcu::TestContext::getLog(this_00);
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,context_00,log,GLSL_VERSION_300_ES,PRECISION_HIGHP);
  return;
}

Assistant:

Texture2DLodControlCase::Texture2DLodControlCase (Context& context, const char* name, const char* desc, deUint32 minFilter)
	: TestCase		(context, name, desc)
	, m_texWidth	(64)
	, m_texHeight	(64)
	, m_minFilter	(minFilter)
	, m_texture		(DE_NULL)
	, m_renderer	(context.getRenderContext(), context.getTestContext().getLog(), glu::GLSL_VERSION_300_ES, glu::PRECISION_HIGHP)
{
}